

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::placeTip(QTipLabel *this,QPoint *pos,QWidget *w)

{
  QPoint QVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  QObject *object;
  QStyleSheetStyle *pQVar4;
  QScreen *pQVar5;
  QPlatformScreen *context;
  long *plVar6;
  QSize QVar7;
  int iVar8;
  int iVar9;
  QWidget **extraout_RDX;
  QWidget **extraout_RDX_00;
  QWidget **value;
  int iVar10;
  int iVar11;
  QTipLabel *pQVar12;
  int iVar13;
  Representation RVar14;
  int iVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined1 auVar19 [16];
  QSize local_70;
  Object local_68 [8];
  QWidget *w_local;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w_local = w;
  bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_StyleSheet);
  value = extraout_RDX;
  if (!bVar3) {
    if (w == (QWidget *)0x0) {
      w = (QWidget *)0x0;
      goto LAB_00380402;
    }
    object = &QWidget::style(w)->super_QObject;
    pQVar4 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
    value = extraout_RDX_00;
    if (pQVar4 == (QStyleSheetStyle *)0x0) goto LAB_00380402;
  }
  pQVar12 = instance;
  ::QVariant::fromValue<QWidget*>
            ((enable_if_t<std::is_copy_constructible_v<QWidget_*>_&&_std::is_destructible_v<QWidget_*>,_QVariant>
              *)local_58,(QVariant *)&w_local,value);
  QObject::setProperty
            ((QObject *)pQVar12,"_q_stylesheet_parent",
             (enable_if_t<std::is_copy_constructible_v<QWidget_*>_&&_std::is_destructible_v<QWidget_*>,_QVariant>
              *)local_58);
  ::QVariant::~QVariant
            ((enable_if_t<std::is_copy_constructible_v<QWidget_*>_&&_std::is_destructible_v<QWidget_*>,_QVariant>
              *)local_58);
  pQVar12 = instance;
  latin1.m_data = "/* */";
  latin1.m_size = 5;
  QString::QString((QString *)local_58,latin1);
  QWidget::setStyleSheet((QWidget *)pQVar12,(QString *)local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  pQVar12 = instance;
  instance->styleSheetParent = w_local;
  if (w_local != (QWidget *)0x0) {
    local_58._0_8_ = styleSheetParentDestroyed;
    local_58._8_8_ = 0;
    QObject::connect<void(QObject::*)(QObject*),void(QTipLabel::*)()>
              (local_68,(offset_in_QObject_to_subr)w_local,(ContextType *)QObject::destroyed,
               (offset_in_QTipLabel_to_subr *)0x0,(ConnectionType)pQVar12);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    pQVar12 = instance;
  }
  updateSize(pQVar12,pos);
  w = w_local;
LAB_00380402:
  QVar1 = *pos;
  local_58._0_8_ = QVar1;
  pQVar5 = getTipScreen(pos,w);
  if ((pQVar5 != (QScreen *)0x0) &&
     (context = (QPlatformScreen *)QScreen::handle(), context != (QPlatformScreen *)0x0)) {
    plVar6 = (long *)(**(code **)(*(long *)context + 0xb0))(context);
    if (plVar6 == (long *)0x0) {
      local_70.wd.m_i = 0x10;
      local_70.ht.m_i = 0x10;
    }
    else {
      local_70 = (QSize)(**(code **)(*plVar6 + 0x90))(plVar6);
    }
    QVar7 = QHighDpi::fromNativePixels<QSize,QPlatformScreen>(&local_70,context);
    pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
    RVar16.m_i = 0;
    iVar8 = (int)((long)((ulong)(uint)(QVar7.wd.m_i.m_i >> 0x1f) << 0x20 | (ulong)QVar7 & 0xffffffff
                        ) / 2);
    if (QVar7.ht.m_i.m_i <= ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) * 2 + 2) {
      RVar16.m_i = QVar7.ht.m_i.m_i;
      iVar8 = 2;
    }
    RVar18.m_i = iVar8 + QVar1.xp.m_i.m_i;
    RVar17.m_i = RVar16.m_i + QVar1.yp.m_i.m_i;
    local_58._4_4_ = RVar17.m_i;
    local_58._0_4_ = RVar18.m_i;
    auVar19 = QScreen::geometry();
    pQVar2 = (this->super_QLabel).super_QFrame.super_QWidget.data;
    iVar8 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    iVar9 = iVar8 + 1;
    iVar10 = auVar19._8_4_ + 1;
    if (iVar10 < iVar8 + RVar18.m_i + 1) {
      RVar18.m_i = (RVar18.m_i - iVar9) + -4;
      local_58._0_4_ = RVar18.m_i;
    }
    iVar11 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    iVar15 = iVar11 + RVar17.m_i + 1;
    iVar11 = iVar11 + 1;
    iVar8 = auVar19._12_4_ + 1;
    RVar14.m_i = (RVar17.m_i - iVar11) + -0x18;
    if (iVar15 <= iVar8) {
      RVar14.m_i = RVar17.m_i;
    }
    iVar13 = auVar19._4_4_;
    RVar17.m_i = iVar13;
    if (iVar13 < RVar14.m_i) {
      RVar17.m_i = RVar14.m_i;
    }
    if ((iVar8 < iVar15) || (RVar14.m_i < iVar13)) {
      local_58._4_4_ = RVar17.m_i;
    }
    iVar15 = iVar10 - iVar9;
    if (iVar9 + RVar18.m_i <= iVar10) {
      iVar15 = RVar18.m_i;
    }
    RVar14.m_i = auVar19._0_4_;
    if ((iVar10 < iVar9 + RVar18.m_i) || (iVar15 < RVar14.m_i)) {
      if (RVar14.m_i < iVar15) {
        RVar14.m_i = iVar15;
      }
      local_58._0_4_ = RVar14.m_i;
    }
    if (iVar8 < RVar17.m_i + iVar11) {
      local_58._4_4_ = iVar8 - iVar11;
    }
  }
  QWidget::move((QWidget *)this,(QPoint *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTipLabel::placeTip(const QPoint &pos, QWidget *w)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (testAttribute(Qt::WA_StyleSheet) || (w && qt_styleSheet(w->style()))) {
        //the stylesheet need to know the real parent
        QTipLabel::instance->setProperty("_q_stylesheet_parent", QVariant::fromValue(w));
        //we force the style to be the QStyleSheetStyle, and force to clear the cache as well.
        QTipLabel::instance->setStyleSheet("/* */"_L1);

        // Set up for cleaning up this later...
        QTipLabel::instance->styleSheetParent = w;
        if (w) {
            connect(w, &QWidget::destroyed,
                    QTipLabel::instance, &QTipLabel::styleSheetParentDestroyed);
        }
        // QTBUG-64550: A font inherited by the style sheet might change the size,
        // particular on Windows, where the tip is not parented on a window.
        // The updatesSize() also makes sure that the content size be updated with
        // correct content margin.
        QTipLabel::instance->updateSize(pos);
    }
#endif //QT_NO_STYLE_STYLESHEET

    QPoint p = pos;
    const QScreen *screen = getTipScreen(pos, w);
    // a QScreen's handle *should* never be null, so this is a bit paranoid
    if (const QPlatformScreen *platformScreen = screen ? screen->handle() : nullptr) {
        QPlatformCursor *cursor = platformScreen->cursor();
        // default implementation of QPlatformCursor::size() returns QSize(16, 16)
        const QSize nativeSize = cursor ? cursor->size() : QSize(16, 16);
        const QSize cursorSize = QHighDpi::fromNativePixels(nativeSize,
                                                            platformScreen);
        QPoint offset(2, cursorSize.height());
        // assuming an arrow shape, we can just move to the side for very large cursors
        if (cursorSize.height() > 2 * this->height())
            offset = QPoint(cursorSize.width() / 2, 0);

        p += offset;

        QRect screenRect = screen->geometry();
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
        p.rx() -= 4 + this->width();
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
        p.ry() -= 24 + this->height();
        if (p.y() < screenRect.y())
            p.setY(screenRect.y());
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
            p.setX(screenRect.x() + screenRect.width() - this->width());
        if (p.x() < screenRect.x())
            p.setX(screenRect.x());
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
            p.setY(screenRect.y() + screenRect.height() - this->height());
    }
    this->move(p);
}